

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void __thiscall
Js::JavascriptLibrary::SetCrossSiteForLockedNonBuiltInFunctionType
          (JavascriptLibrary *this,JavascriptFunction *function)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  DynamicType *in_RAX;
  FunctionProxy *this_00;
  DynamicTypeHandler *pDVar4;
  ScriptFunctionType *pSVar5;
  PathTypeHandlerBase *pPVar6;
  undefined4 *puVar7;
  ScriptFunction *pSVar8;
  undefined4 extraout_var;
  FunctionInfo *pFVar9;
  DynamicType *local_38;
  DynamicType *type;
  
  local_38 = in_RAX;
  this_00 = JavascriptFunction::GetFunctionProxy(function);
  pDVar4 = DynamicObject::GetTypeHandler(&function->super_DynamicObject);
  iVar3 = (*pDVar4->_vptr_DynamicTypeHandler[0x4d])(pDVar4);
  if (iVar3 == 0) {
    if ((this_00 != (FunctionProxy *)0x0) &&
       (pSVar5 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00),
       pSVar5 != (ScriptFunctionType *)0x0)) {
      pSVar5 = FunctionProxy::GetCrossSiteUndeferredFunctionType(this_00);
      goto LAB_00beda8a;
    }
    iVar3 = (*pDVar4->_vptr_DynamicTypeHandler[0x4e])(pDVar4);
    if (iVar3 == 0) {
      DynamicObject::ChangeType(&function->super_DynamicObject);
    }
    else {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ShareCrossSiteFuncTypesPhase);
      if (bVar2) {
        pPVar6 = PathTypeHandlerBase::FromTypeHandler(pDVar4);
        PathTypeHandlerBase::ConvertToNonShareableTypeHandler(pPVar6,&function->super_DynamicObject)
        ;
      }
      else {
        iVar3 = (*(function->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x67])(function);
        local_38 = (DynamicType *)CONCAT44(extraout_var,iVar3);
        pPVar6 = PathTypeHandlerBase::FromTypeHandler(pDVar4);
        PathTypeHandlerBase::BuildPathTypeFromNewRoot
                  (pPVar6,&function->super_DynamicObject,&local_38);
        DynamicObject::ReplaceType(&function->super_DynamicObject,local_38);
      }
    }
    JavascriptFunction::SetEntryPoint
              (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                        CurrentCrossSiteThunk);
    if (this_00 != (FunctionProxy *)0x0) {
      pFVar9 = (this_00->functionInfo).ptr;
      if (pFVar9 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_00bedde0;
        *puVar7 = 0;
        pFVar9 = (this_00->functionInfo).ptr;
      }
      if ((pFVar9->functionBodyImpl).ptr != this_00) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar2) goto LAB_00bedde0;
        *puVar7 = 0;
        pFVar9 = (this_00->functionInfo).ptr;
        if ((pFVar9->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
          return;
        }
      }
      if ((((pFVar9->attributes & DeferredDeserialize) == None) &&
          (pDVar4 = DynamicObject::GetTypeHandler(&function->super_DynamicObject),
          (pDVar4->flags & 8) != 0)) &&
         (bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ShareCrossSiteFuncTypesPhase), !bVar2))
      {
        DynamicObject::ShareType(&function->super_DynamicObject);
        pSVar8 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(function);
        pSVar5 = ScriptFunction::GetScriptFunctionType(pSVar8);
        FunctionProxy::SetCrossSiteUndeferredFunctionType(this_00,pSVar5);
      }
    }
  }
  else {
    if (this_00 == (FunctionProxy *)0x0) {
      DynamicObject::ChangeType(&function->super_DynamicObject);
      JavascriptFunction::SetEntryPoint
                (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                          CurrentCrossSiteThunk);
      return;
    }
    pSVar5 = FunctionProxy::GetCrossSiteDeferredFunctionType(this_00);
    if (pSVar5 != (ScriptFunctionType *)0x0) {
      pSVar5 = FunctionProxy::GetCrossSiteDeferredFunctionType(this_00);
LAB_00beda8a:
      DynamicObject::ReplaceType(&function->super_DynamicObject,&pSVar5->super_DynamicType);
      return;
    }
    DynamicObject::ChangeType(&function->super_DynamicObject);
    JavascriptFunction::SetEntryPoint
              (function,((this->super_JavascriptLibraryBase).scriptContext.ptr)->
                        CurrentCrossSiteThunk);
    pFVar9 = (this_00->functionInfo).ptr;
    if (pFVar9 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_00bedde0;
      *puVar7 = 0;
      pFVar9 = (this_00->functionInfo).ptr;
    }
    if ((pFVar9->functionBodyImpl).ptr != this_00) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) {
LAB_00bedde0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
      pFVar9 = (this_00->functionInfo).ptr;
      if ((pFVar9->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
        return;
      }
    }
    if (((pFVar9->attributes & DeferredDeserialize) == None) &&
       (bVar2 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ShareCrossSiteFuncTypesPhase), !bVar2)) {
      DynamicObject::ShareType(&function->super_DynamicObject);
      pSVar8 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(function);
      pSVar5 = ScriptFunction::GetScriptFunctionType(pSVar8);
      FunctionProxy::SetCrossSiteDeferredFunctionType(this_00,pSVar5);
      return;
    }
  }
  return;
}

Assistant:

void JavascriptLibrary::SetCrossSiteForLockedNonBuiltInFunctionType(JavascriptFunction * function)
    {
        FunctionProxy * functionProxy = function->GetFunctionProxy();
        DynamicTypeHandler *typeHandler = function->GetTypeHandler();
        if (typeHandler->IsDeferredTypeHandler())
        {
            if (functionProxy && functionProxy->GetCrossSiteDeferredFunctionType())
            {
                function->ReplaceType(functionProxy->GetCrossSiteDeferredFunctionType());
            }
            else
            {
                function->ChangeType();
                function->SetEntryPoint(scriptContext->CurrentCrossSiteThunk);
                if (functionProxy && functionProxy->HasParseableInfo() && !PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                {
                    function->ShareType();
                    functionProxy->SetCrossSiteDeferredFunctionType(UnsafeVarTo<ScriptFunction>(function)->GetScriptFunctionType());
                }
            }
        }
        else 
        {
            if (functionProxy && functionProxy->GetCrossSiteUndeferredFunctionType())
            {
                function->ReplaceType(functionProxy->GetCrossSiteUndeferredFunctionType());
            }
            else
            {
                if (typeHandler->IsPathTypeHandler())
                {
                    if (!PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                    {
                        DynamicType *type = function->DuplicateType();
                        PathTypeHandlerBase::FromTypeHandler(typeHandler)->BuildPathTypeFromNewRoot(function, &type);
                        function->ReplaceType(type);
                    }
                    else
                    {
                        PathTypeHandlerBase::FromTypeHandler(typeHandler)->ConvertToNonShareableTypeHandler(function);
                    }
                }
                else
                {
                    function->ChangeType();
                }
                function->SetEntryPoint(scriptContext->CurrentCrossSiteThunk);
                if (functionProxy && functionProxy->HasParseableInfo() && function->GetTypeHandler()->GetMayBecomeShared() && !PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                {
                    function->ShareType();
                    functionProxy->SetCrossSiteUndeferredFunctionType(UnsafeVarTo<ScriptFunction>(function)->GetScriptFunctionType());
                }
            }
        }
    }